

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Instr * __thiscall Lowerer::AddSlotArrayCheck(Lowerer *this,PropertySym *propertySym,Instr *instr)

{
  OpCode OVar1;
  uint uVar2;
  StackSym *pSVar3;
  Instr *this_00;
  Instr *this_01;
  bool bVar4;
  bool bVar5;
  uint sourceContextId;
  uint functionId;
  uint32 uVar6;
  uint uVar7;
  StackSym *pSVar8;
  Opnd *pOVar9;
  IntConstOpnd *pIVar10;
  RegOpnd *pRVar11;
  Instr *this_02;
  IntConstOpnd *slotIdOpnd;
  Instr *checkInstr;
  RegOpnd *dstOpnd;
  Instr *insertInstr;
  uint32 currentSlotId;
  uint32 allocCount;
  Opnd *allocOpnd;
  uint32 slotId;
  bool insertSlotArrayCheck;
  bool doDynamicCheck;
  Instr *instrDef;
  Instr *instr_local;
  PropertySym *propertySym_local;
  Lowerer *this_local;
  
  pSVar3 = propertySym->m_stackSym;
  pSVar8 = Func::GetLocalClosureSym(this->m_func);
  if (pSVar3 != pSVar8) {
LAB_007ab7af:
    return instr->m_prev;
  }
  sourceContextId = Func::GetSourceContextId(this->m_func);
  functionId = Func::GetLocalFunctionId(this->m_func);
  bVar4 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_01eafdf0,ClosureRangeCheckPhase,sourceContextId,functionId);
  if (bVar4) goto LAB_007ab7af;
  this_00 = (propertySym->m_stackSym->field_5).m_instrDef;
  bVar5 = Func::IsLoopBody(this->m_func);
  bVar4 = false;
  uVar2 = propertySym->m_propertyId;
  if (this_00 == (Instr *)0x0) goto LAB_007ab91c;
  OVar1 = this_00->m_opcode;
  if (OVar1 != LdSlot) {
    if (OVar1 == ArgIn_A) goto LAB_007ab91c;
    if (OVar1 != LdSlotArr) {
      if (((ushort)(OVar1 - NewScopeSlots) < 2) || (OVar1 == NewScopeSlotsWithoutPropIds)) {
        pOVar9 = IR::Instr::GetSrc1(this_00);
        pIVar10 = IR::Opnd::AsIntConstOpnd(pOVar9);
        uVar6 = IR::IntConstOpnd::AsUint32(pIVar10);
        if (uVar6 <= uVar2) {
          Js::Throw::FatalInternalError(-0x7fffbffb);
        }
      }
      else {
        if (OVar1 != SlotArrayCheck) {
          Js::Throw::FatalInternalError(-0x7fffbffb);
        }
        pOVar9 = IR::Instr::GetSrc2(this_00);
        pIVar10 = IR::Opnd::AsIntConstOpnd(pOVar9);
        uVar7 = IR::IntConstOpnd::AsInt32(pIVar10);
        if (uVar7 < uVar2) {
          pIVar10 = IR::IntConstOpnd::New((ulong)uVar2,TyUint32,this->m_func,false);
          IR::Instr::ReplaceSrc2(this_00,&pIVar10->super_Opnd);
        }
      }
      goto LAB_007ab91c;
    }
  }
  if ((bVar5) && (2 < uVar2)) {
    bVar4 = true;
  }
LAB_007ab91c:
  if (bVar4) {
    this_01 = this_00->m_next;
    pOVar9 = IR::Instr::UnlinkDst(this_00);
    pRVar11 = IR::Opnd::AsRegOpnd(pOVar9);
    this_02 = IR::Instr::New(SlotArrayCheck,&pRVar11->super_Opnd,this->m_func);
    pRVar11 = IR::RegOpnd::New(TyVar,this->m_func);
    IR::Instr::SetDst(this_00,&pRVar11->super_Opnd);
    IR::Instr::SetSrc1(this_02,&pRVar11->super_Opnd);
    pIVar10 = IR::IntConstOpnd::New((ulong)uVar2,TyUint32,this->m_func,false);
    IR::Instr::SetSrc2(this_02,&pIVar10->super_Opnd);
    IR::Instr::InsertBefore(this_01,this_02);
  }
  return instr->m_prev;
}

Assistant:

IR::Instr* Lowerer::AddSlotArrayCheck(PropertySym *propertySym, IR::Instr* instr)
{
    if (propertySym->m_stackSym != m_func->GetLocalClosureSym() || PHASE_OFF(Js::ClosureRangeCheckPhase, m_func))
    {
        return instr->m_prev;
    }

    IR::Instr *instrDef = propertySym->m_stackSym->m_instrDef;

    bool doDynamicCheck = this->m_func->IsLoopBody();
    bool insertSlotArrayCheck = false;
    uint32 slotId = (uint32)propertySym->m_propertyId;

    if (instrDef)
    {
        switch (instrDef->m_opcode)
        {
        case Js::OpCode::NewScopeSlots:
        case Js::OpCode::NewStackScopeSlots:
        case Js::OpCode::NewScopeSlotsWithoutPropIds:
        {
            IR::Opnd *allocOpnd = allocOpnd = instrDef->GetSrc1();
            uint32 allocCount = allocOpnd->AsIntConstOpnd()->AsUint32();

            if (slotId >= allocCount)
            {
                Js::Throw::FatalInternalError();
            }
            break;
        }
        case Js::OpCode::ArgIn_A:
            break;
        case Js::OpCode::LdSlot:
        case Js::OpCode::LdSlotArr:
        {
            if (doDynamicCheck && slotId > Js::ScopeSlots::FirstSlotIndex)
            {
                insertSlotArrayCheck = true;
            }
            break;
        }
        case Js::OpCode::SlotArrayCheck:
        {
            uint32 currentSlotId = instrDef->GetSrc2()->AsIntConstOpnd()->AsInt32();
            if (slotId > currentSlotId)
            {
                instrDef->ReplaceSrc2(IR::IntConstOpnd::New(slotId, TyUint32, m_func));
            }
            break;
        }
        default:
            Js::Throw::FatalInternalError();
        }
    }
    if (insertSlotArrayCheck)
    {
        IR::Instr *insertInstr = instrDef->m_next;
        IR::RegOpnd *dstOpnd = instrDef->UnlinkDst()->AsRegOpnd();
        IR::Instr *checkInstr = IR::Instr::New(Js::OpCode::SlotArrayCheck, dstOpnd, m_func);

        dstOpnd = IR::RegOpnd::New(TyVar, m_func);
        instrDef->SetDst(dstOpnd);
        checkInstr->SetSrc1(dstOpnd);

        // Attach the slot ID to the check instruction.
        IR::IntConstOpnd *slotIdOpnd = IR::IntConstOpnd::New(slotId, TyUint32, m_func);
        checkInstr->SetSrc2(slotIdOpnd);
        insertInstr->InsertBefore(checkInstr);
    }
    return instr->m_prev;
}